

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_panel.cxx
# Opt level: O0

Fl_Double_Window * make_settings_window(void)

{
  int minw;
  int minh;
  Fl_Window *pFVar1;
  Fl_Menu_ *this;
  Fl_Group *pFVar2;
  Fl_Widget *pFVar3;
  Fl_Button *pFVar4;
  Fl_Spinner *this_00;
  Fl_Group *this_01;
  Fl_Button *o_4;
  Fl_Group *o_3;
  int local_40;
  int c;
  int b_3;
  int b_2;
  int b_1;
  int b;
  Fl_Box *o_2;
  Fl_Group *o_1;
  int s;
  Fl_Window *local_10;
  Fl_Double_Window *o;
  
  pFVar1 = (Fl_Window *)operator_new(0xf0);
  Fl_Double_Window::Fl_Double_Window((Fl_Double_Window *)pFVar1,0x168,0x163,"GUI Settings");
  settings_window = (Fl_Double_Window *)pFVar1;
  local_10 = pFVar1;
  this = (Fl_Menu_ *)operator_new(0x98);
  Fl_Choice::Fl_Choice((Fl_Choice *)this,0x8c,10,0x73,0x19,"Scheme: ");
  scheme_choice = (Fl_Choice *)this;
  Fl_Menu_::down_box(this,FL_BORDER_BOX);
  Fl_Widget::labelfont((Fl_Widget *)scheme_choice,1);
  Fl_Widget::callback((Fl_Widget *)scheme_choice,scheme_cb);
  Fl_Menu_::menu(&scheme_choice->super_Fl_Menu_,menu_scheme_choice);
  Fl_Preferences::get(&fluid_prefs,"scheme",(int *)&o_1,0);
  Fl_Choice::value(scheme_choice,(int)o_1);
  scheme_cb((Fl_Choice *)0x0,(void *)0x0);
  pFVar2 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar2,0x14,0x2b,0x14a,0xa1,(char *)0x0);
  o_2 = (Fl_Box *)pFVar2;
  Fl_Widget::labelfont((Fl_Widget *)pFVar2,1);
  Fl_Widget::align(&o_2->super_Fl_Widget,0);
  pFVar3 = (Fl_Widget *)operator_new(0x78);
  Fl_Box::Fl_Box((Fl_Box *)pFVar3,0x8c,0x2b,1,0x19,"Options: ");
  _b_1 = pFVar3;
  Fl_Widget::labelfont(pFVar3,1);
  Fl_Widget::align(_b_1,4);
  pFVar4 = (Fl_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button((Fl_Check_Button *)pFVar4,0x8a,0x2b,0x71,0x19,"Show Tooltips");
  tooltips_button = (Fl_Check_Button *)pFVar4;
  Fl_Button::down_box(pFVar4,FL_DOWN_BOX);
  Fl_Widget::labelsize((Fl_Widget *)tooltips_button,0xc);
  Fl_Widget::callback((Fl_Widget *)tooltips_button,cb_tooltips_button);
  Fl_Preferences::get(&fluid_prefs,"show_tooltips",&b_2,1);
  Fl_Button::value((Fl_Button *)tooltips_button,b_2);
  Fl_Tooltip::enable(b_2);
  pFVar4 = (Fl_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button
            ((Fl_Check_Button *)pFVar4,0x8a,0x44,0xba,0x19,"Show Completion Dialogs");
  completion_button = (Fl_Check_Button *)pFVar4;
  Fl_Button::down_box(pFVar4,FL_DOWN_BOX);
  Fl_Widget::labelsize((Fl_Widget *)completion_button,0xc);
  Fl_Widget::callback((Fl_Widget *)completion_button,cb_completion_button);
  Fl_Preferences::get(&fluid_prefs,"show_completion_dialogs",&b_3,1);
  Fl_Button::value((Fl_Button *)completion_button,b_3);
  pFVar4 = (Fl_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button
            ((Fl_Check_Button *)pFVar4,0x8a,0x5d,0xd6,0x19,"Open Previous File on Startup");
  openlast_button = (Fl_Check_Button *)pFVar4;
  Fl_Button::down_box(pFVar4,FL_DOWN_BOX);
  Fl_Widget::labelsize((Fl_Widget *)openlast_button,0xc);
  Fl_Widget::callback((Fl_Widget *)openlast_button,cb_openlast_button);
  Fl_Preferences::get(&fluid_prefs,"open_previous_file",&c,0);
  Fl_Button::value((Fl_Button *)openlast_button,c);
  pFVar4 = (Fl_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button
            ((Fl_Check_Button *)pFVar4,0x8a,0x76,0xd1,0x19,"Remember Window Positions");
  prevpos_button = (Fl_Check_Button *)pFVar4;
  Fl_Button::down_box(pFVar4,FL_DOWN_BOX);
  Fl_Widget::labelsize((Fl_Widget *)prevpos_button,0xc);
  Fl_Widget::callback((Fl_Widget *)prevpos_button,cb_prevpos_button);
  Fl_Preferences::get(&fluid_prefs,"prev_window_pos",&local_40,1);
  Fl_Button::value((Fl_Button *)prevpos_button,local_40);
  pFVar4 = (Fl_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button
            ((Fl_Check_Button *)pFVar4,0x8a,0x8f,0xd1,0x19,"Show Comments in Browser");
  show_comments_button = (Fl_Check_Button *)pFVar4;
  Fl_Button::down_box(pFVar4,FL_DOWN_BOX);
  Fl_Widget::labelsize((Fl_Widget *)show_comments_button,0xc);
  Fl_Widget::callback((Fl_Widget *)show_comments_button,cb_show_comments_button);
  Fl_Preferences::get(&fluid_prefs,"show_comments",&show_comments,1);
  Fl_Button::value((Fl_Button *)show_comments_button,show_comments);
  Fl_Group::end((Fl_Group *)o_2);
  this_00 = (Fl_Spinner *)operator_new(0x290);
  Fl_Spinner::Fl_Spinner(this_00,0x8c,0xad,0x28,0x19,"# Recent Files: ");
  recent_spinner = this_00;
  Fl_Widget::labelfont((Fl_Widget *)this_00,1);
  Fl_Widget::callback((Fl_Widget *)recent_spinner,cb_recent_spinner);
  Fl_Widget::when((Fl_Widget *)recent_spinner,'\x01');
  Fl_Preferences::get(&fluid_prefs,"recent_files",(int *)((long)&o_3 + 4),5);
  Fl_Spinner::maximum(recent_spinner,10.0);
  Fl_Spinner::value(recent_spinner,(double)o_3._4_4_);
  pFVar2 = (Fl_Group *)operator_new(0xa0);
  Fl_Group::Fl_Group(pFVar2,10,0xd2,0x151,0x5f,(char *)0x0);
  Fl_Widget::box((Fl_Widget *)pFVar2,FL_THIN_UP_BOX);
  Fl_Widget::color((Fl_Widget *)pFVar2,0x2f);
  pFVar4 = (Fl_Button *)operator_new(0x80);
  Fl_Check_Button::Fl_Check_Button
            ((Fl_Check_Button *)pFVar4,0x19,0xda,0xd1,0x16,"Use external editor?");
  use_external_editor_button = (Fl_Check_Button *)pFVar4;
  Fl_Button::down_box(pFVar4,FL_DOWN_BOX);
  Fl_Widget::labelsize((Fl_Widget *)use_external_editor_button,0xc);
  Fl_Widget::callback((Fl_Widget *)use_external_editor_button,cb_use_external_editor_button);
  Fl_Preferences::get(&fluid_prefs,"use_external_editor",&G_use_external_editor,0);
  Fl_Button::value((Fl_Button *)use_external_editor_button,G_use_external_editor);
  pFVar3 = (Fl_Widget *)operator_new(200);
  Fl_Input::Fl_Input((Fl_Input *)pFVar3,0x19,0x108,0x131,0x15,"Editor Command");
  editor_command_input = (Fl_Input *)pFVar3;
  Fl_Widget::tooltip(pFVar3,
                     "The editor command to open your external text editor.\nInclude any necessary flags to ensure your editor does not background itself.\nExamples:\n    gvim -f\n    gedit\n emacs"
                    );
  Fl_Widget::labelsize((Fl_Widget *)editor_command_input,0xc);
  Fl_Input_::textsize(&editor_command_input->super_Fl_Input_,0xc);
  Fl_Widget::callback((Fl_Widget *)editor_command_input,cb_editor_command_input);
  Fl_Widget::align((Fl_Widget *)editor_command_input,5);
  Fl_Widget::when((Fl_Widget *)editor_command_input,'\x01');
  Fl_Preferences::get(&fluid_prefs,"external_editor_command",G_external_editor_command,"",0x1ff);
  Fl_Input_::value(&editor_command_input->super_Fl_Input_,G_external_editor_command);
  Fl_Group::end(pFVar2);
  this_01 = Fl_Group::current();
  Fl_Group::resizable(this_01,(Fl_Widget *)pFVar2);
  pFVar4 = (Fl_Button *)operator_new(0x80);
  Fl_Button::Fl_Button(pFVar4,0x11d,0x140,0x40,0x19,"Close");
  Fl_Widget::tooltip((Fl_Widget *)pFVar4,"Close this dialog.");
  Fl_Widget::callback((Fl_Widget *)pFVar4,cb_Close1);
  pFVar1 = local_10;
  minw = Fl_Widget::w((Fl_Widget *)local_10);
  minh = Fl_Widget::h((Fl_Widget *)local_10);
  Fl_Window::size_range(pFVar1,minw,minh,0,0,0,0,0);
  Fl_Window::set_non_modal(&settings_window->super_Fl_Window);
  Fl_Group::end((Fl_Group *)settings_window);
  return settings_window;
}

Assistant:

Fl_Double_Window* make_settings_window() {
  { Fl_Double_Window* o = settings_window = new Fl_Double_Window(360, 355, "GUI Settings");
    { scheme_choice = new Fl_Choice(140, 10, 115, 25, "Scheme: ");
      scheme_choice->down_box(FL_BORDER_BOX);
      scheme_choice->labelfont(1);
      scheme_choice->callback((Fl_Callback*)scheme_cb);
      scheme_choice->menu(menu_scheme_choice);
      int s;
      fluid_prefs.get("scheme", s, 0);
      scheme_choice->value(s);
      scheme_cb(0, 0);
    } // Fl_Choice* scheme_choice
    { Fl_Group* o = new Fl_Group(20, 43, 330, 161);
      o->labelfont(1);
      o->align(Fl_Align(FL_ALIGN_CENTER));
      { Fl_Box* o = new Fl_Box(140, 43, 1, 25, "Options: ");
        o->labelfont(1);
        o->align(Fl_Align(FL_ALIGN_LEFT));
      } // Fl_Box* o
      { tooltips_button = new Fl_Check_Button(138, 43, 113, 25, "Show Tooltips");
        tooltips_button->down_box(FL_DOWN_BOX);
        tooltips_button->labelsize(12);
        tooltips_button->callback((Fl_Callback*)cb_tooltips_button);
        int b;
        fluid_prefs.get("show_tooltips", b, 1);
        tooltips_button->value(b);
        Fl_Tooltip::enable(b);
      } // Fl_Check_Button* tooltips_button
      { completion_button = new Fl_Check_Button(138, 68, 186, 25, "Show Completion Dialogs");
        completion_button->down_box(FL_DOWN_BOX);
        completion_button->labelsize(12);
        completion_button->callback((Fl_Callback*)cb_completion_button);
        int b;
        fluid_prefs.get("show_completion_dialogs", b, 1);
        completion_button->value(b);
      } // Fl_Check_Button* completion_button
      { openlast_button = new Fl_Check_Button(138, 93, 214, 25, "Open Previous File on Startup");
        openlast_button->down_box(FL_DOWN_BOX);
        openlast_button->labelsize(12);
        openlast_button->callback((Fl_Callback*)cb_openlast_button);
        int b;
        fluid_prefs.get("open_previous_file", b, 0);
        openlast_button->value(b);
      } // Fl_Check_Button* openlast_button
      { prevpos_button = new Fl_Check_Button(138, 118, 209, 25, "Remember Window Positions");
        prevpos_button->down_box(FL_DOWN_BOX);
        prevpos_button->labelsize(12);
        prevpos_button->callback((Fl_Callback*)cb_prevpos_button);
        int b;
        fluid_prefs.get("prev_window_pos", b, 1);
        prevpos_button->value(b);
      } // Fl_Check_Button* prevpos_button
      { show_comments_button = new Fl_Check_Button(138, 143, 209, 25, "Show Comments in Browser");
        show_comments_button->down_box(FL_DOWN_BOX);
        show_comments_button->labelsize(12);
        show_comments_button->callback((Fl_Callback*)cb_show_comments_button);
        fluid_prefs.get("show_comments", show_comments, 1);
        show_comments_button->value(show_comments);
      } // Fl_Check_Button* show_comments_button
      o->end();
    } // Fl_Group* o
    { recent_spinner = new Fl_Spinner(140, 173, 40, 25, "# Recent Files: ");
      recent_spinner->labelfont(1);
      recent_spinner->callback((Fl_Callback*)cb_recent_spinner);
      recent_spinner->when(FL_WHEN_CHANGED);
      int c;
      fluid_prefs.get("recent_files", c, 5);
      recent_spinner->maximum(10);
      recent_spinner->value(c);
    } // Fl_Spinner* recent_spinner
    { Fl_Group* o = new Fl_Group(10, 210, 337, 95);
      o->box(FL_THIN_UP_BOX);
      o->color(FL_DARK1);
      { use_external_editor_button = new Fl_Check_Button(25, 218, 209, 22, "Use external editor?");
        use_external_editor_button->down_box(FL_DOWN_BOX);
        use_external_editor_button->labelsize(12);
        use_external_editor_button->callback((Fl_Callback*)cb_use_external_editor_button);
        fluid_prefs.get("use_external_editor", G_use_external_editor, 0);
        use_external_editor_button->value(G_use_external_editor);
      } // Fl_Check_Button* use_external_editor_button
      { editor_command_input = new Fl_Input(25, 264, 305, 21, "Editor Command");
        editor_command_input->tooltip("The editor command to open your external text editor.\nInclude any necessary \
flags to ensure your editor does not background itself.\nExamples:\n    gvim -\
f\n    gedit\n emacs");
        editor_command_input->labelsize(12);
        editor_command_input->textsize(12);
        editor_command_input->callback((Fl_Callback*)cb_editor_command_input);
        editor_command_input->align(Fl_Align(FL_ALIGN_TOP_LEFT));
        editor_command_input->when(FL_WHEN_CHANGED);
        fluid_prefs.get("external_editor_command", G_external_editor_command, "", sizeof(G_external_editor_command)-1);
        editor_command_input->value(G_external_editor_command);
      } // Fl_Input* editor_command_input
      o->end();
      Fl_Group::current()->resizable(o);
    } // Fl_Group* o
    { Fl_Button* o = new Fl_Button(285, 320, 64, 25, "Close");
      o->tooltip("Close this dialog.");
      o->callback((Fl_Callback*)cb_Close1);
    } // Fl_Button* o
    o->size_range(o->w(), o->h());
    settings_window->set_non_modal();
    settings_window->end();
  } // Fl_Double_Window* settings_window
  return settings_window;
}